

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_server_state_e handle_wait_io_timeout(pcp_server_t *s)

{
  timeval *x;
  timeval ctv;
  
  x = &s->next_timeout;
  (s->next_timeout).tv_sec = 0;
  (s->next_timeout).tv_usec = 0;
  pcp_db_foreach_flow(s->ctx,check_flow_timeout,x);
  if (((s->next_timeout).tv_sec != 0) || ((s->next_timeout).tv_usec != 0)) {
    gettimeofday((timeval *)&ctv,(__timezone_ptr_t)0x0);
    x->tv_sec = x->tv_sec + ctv.tv_sec;
    (s->next_timeout).tv_usec = (s->next_timeout).tv_usec + ctv.tv_usec;
    timeval_align(x);
  }
  return pss_wait_io;
}

Assistant:

static pcp_server_state_e handle_wait_io_timeout(pcp_server_t *s) {
    struct timeval ctv;

    s->next_timeout.tv_sec = 0;
    s->next_timeout.tv_usec = 0;

    pcp_db_foreach_flow(s->ctx, check_flow_timeout, &s->next_timeout);

    if ((s->next_timeout.tv_sec != 0) || (s->next_timeout.tv_usec != 0)) {
        gettimeofday(&ctv, NULL);
        s->next_timeout.tv_sec += ctv.tv_sec;
        s->next_timeout.tv_usec += ctv.tv_usec;
        timeval_align(&s->next_timeout);
    }

    return pss_wait_io;
}